

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::skippedString(XMLReader *this,XMLCh *toSkip)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  
  XVar3 = XMLString::stringLen(toSkip);
  XVar5 = this->fCharIndex;
  uVar6 = this->fCharsAvail - XVar5;
  while( true ) {
    if (XVar3 <= uVar6) {
      iVar2 = bcmp(this->fCharBuf + XVar5,toSkip,XVar3 * 2);
      if (iVar2 != 0) {
        return false;
      }
      this->fCurCol = this->fCurCol + XVar3;
      this->fCharIndex = XVar5 + XVar3;
      return true;
    }
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) break;
    XVar5 = this->fCharIndex;
    uVar4 = this->fCharsAvail - XVar5;
    bVar1 = uVar4 == uVar6;
    uVar6 = uVar4;
    if (bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

bool XMLReader::skippedString(const XMLCh* const toSkip)
{
    // This function works on strings that are smaller than kCharBufSize.
    // This function guarantees that in case the comparison is unsuccessful
    // the fCharIndex will point to the original data.
    //

    // Get the length of the string to skip.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    while (charsLeft < srcLen)
    {
      if (!refreshCharBuffer())
        return false;

      XMLSize_t tmp = charsLeftInBuffer();
      if (tmp == charsLeft) // if the refreshCharBuf() did not add anything new
        return false;     // give up and return.

      charsLeft = tmp;
    }

    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toSkip, srcLen * sizeof(XMLCh)))
      return false;

    // Add the source length to the current column to get it back right.
    //
    fCurCol += (XMLFileLoc)srcLen;

    //  And get the character buffer index back right by just adding the
    //  source len to it.
    //
    fCharIndex += srcLen;

    return true;
}